

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O2

char * replace_str(char *str,char *orig,char *rep)

{
  char *pcVar1;
  size_t sVar2;
  size_t __n;
  
  pcVar1 = strstr(str,orig);
  if (pcVar1 != (char *)0x0) {
    __n = (long)pcVar1 - (long)str;
    strncpy(replace_str::buffer,str,__n);
    replace_str::buffer[__n] = '\0';
    sVar2 = strlen(orig);
    sprintf(replace_str::buffer + __n,"%s%s",rep,pcVar1 + sVar2);
    str = replace_str::buffer;
  }
  return str;
}

Assistant:

static char *replace_str(char *str, char *orig, char *rep)
{
  static char buffer[1024];
  char *p;

  if(!(p = strstr(str, orig)))
    return str;

  strncpy(buffer, str, p-str);
  buffer[p-str] = '\0';

  sprintf(buffer+(p-str), "%s%s", rep, p+strlen(orig));

  return buffer;
}